

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O2

void __thiscall bwtil::IndexedBWT::loadFromFile(IndexedBWT *this,FILE *fp)

{
  allocator_type local_99;
  succinct_bitvector local_98;
  
  fread(this,4,1,(FILE *)fp);
  fread(&this->log_sigma,4,1,(FILE *)fp);
  fread(&this->terminator_position,8,1,(FILE *)fp);
  fread(&this->offrate,8,1,(FILE *)fp);
  fread(&this->number_of_SA_pointers,8,1,(FILE *)fp);
  fread(&this->w,4,1,(FILE *)fp);
  fread(&this->n,8,1,(FILE *)fp);
  local_98.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_98.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
  local_98.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  WaveletTree::operator=(&this->bwt_wt,(WaveletTree *)&local_98);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
             &local_98.bitvector);
  WaveletTree::loadFromFile(&this->bwt_wt,fp);
  local_98.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  local_98.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._10_8_ = 0;
  local_98._74_8_ = 0;
  local_98._82_8_ = 0;
  local_98.n = 0;
  local_98.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_98.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
  local_98.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0;
  local_98.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._2_6_ = 0;
  local_98.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  local_98.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish._2_6_ = 0;
  local_98.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_98.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
  local_98.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0;
  local_98.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start._2_6_ = 0;
  succinct_bitvector::operator=(&this->marked_positions,&local_98);
  succinct_bitvector::~succinct_bitvector(&local_98);
  succinct_bitvector::loadFromFile(&this->marked_positions,fp);
  load_packed_view_from_file
            ((packed_view_t *)&local_98,(ulong)this->w,this->number_of_SA_pointers,fp);
  bv::internal::packed_view<std::vector>::operator=
            (&this->text_pointers,(packed_view<std::vector> *)&local_98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,0x100,&local_99);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&this->FIRST,&local_98)
  ;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,0x100,
             (allocator_type *)&local_99);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->remapping,&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,(ulong)this->sigma,
             (allocator_type *)&local_99);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->inverse_remapping,&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  fread((this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start,8,0x100,(FILE *)fp);
  fread((this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start,1,0x100,(FILE *)fp);
  fread((this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start,1,(ulong)this->sigma,(FILE *)fp);
  return;
}

Assistant:

void loadFromFile(FILE *fp){

		ulint numBytes;

		numBytes = fread(&sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&log_sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&terminator_position, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&offrate, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&number_of_SA_pointers, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&w, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&n, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		bwt_wt =  WaveletTree();
		bwt_wt.loadFromFile(fp);

		marked_positions =  succinct_bitvector();
		marked_positions.loadFromFile(fp);
		text_pointers = load_packed_view_from_file(w, number_of_SA_pointers, fp);

		FIRST = vector<ulint>(256);
		remapping = vector<uchar>(256);
		inverse_remapping = vector<uchar>(sigma);

		numBytes = fread(FIRST.data(), sizeof(ulint), 256, fp);
		assert(numBytes>0);
		numBytes = fread(remapping.data(), sizeof(uchar), 256, fp);
		assert(numBytes>0);
		numBytes = fread(inverse_remapping.data(), sizeof(uchar), sigma, fp);
		assert(numBytes>0);

		numBytes++;//avoids "variable not used" warning

	}